

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O1

void AbslInternalSleepFor_lts_20250127(Duration duration)

{
  HiRep this;
  bool bVar1;
  int iVar2;
  int *piVar3;
  undefined8 in_RDX;
  uint uVar4;
  HiRep HVar5;
  Duration d;
  Duration rhs;
  Duration local_50;
  timespec local_40;
  undefined8 extraout_RDX;
  
  local_50.rep_lo_ = duration.rep_lo_;
  local_50.rep_hi_ = duration.rep_hi_;
  bVar1 = 0 < (long)local_50.rep_hi_;
  if (local_50.rep_hi_ == (HiRep)0x0) {
    bVar1 = local_50.rep_lo_ != 0;
  }
  if (bVar1) {
    do {
      HVar5 = local_50.rep_hi_;
      if (local_50.rep_lo_ != 0) {
        HVar5.lo_ = 0xffffffff;
        HVar5.hi_ = 0x7fffffff;
      }
      uVar4 = local_50.rep_lo_;
      this = local_50.rep_hi_;
      if (local_50.rep_hi_ == (HiRep)0x7fffffffffffffff) {
        uVar4 = 0;
        this = HVar5;
      }
      d.rep_hi_.hi_ = 0;
      d.rep_hi_.lo_ = uVar4;
      d.rep_lo_ = (uint32_t)in_RDX;
      local_40 = absl::lts_20250127::ToTimespec((lts_20250127 *)this,d);
      do {
        iVar2 = nanosleep((timespec *)&local_40,(timespec *)&local_40);
        if (iVar2 == 0) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      rhs.rep_lo_ = uVar4;
      rhs.rep_hi_ = this;
      absl::lts_20250127::Duration::operator-=(&local_50,rhs);
      bVar1 = 0 < (long)local_50.rep_hi_;
      if (local_50.rep_hi_ == (HiRep)0x0) {
        bVar1 = local_50.rep_lo_ != 0;
      }
      in_RDX = extraout_RDX;
    } while (bVar1);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_WEAK void ABSL_INTERNAL_C_SYMBOL(AbslInternalSleepFor)(
    absl::Duration duration) {
  while (duration > absl::ZeroDuration()) {
    absl::Duration to_sleep = std::min(duration, absl::MaxSleep());
    absl::SleepOnce(to_sleep);
    duration -= to_sleep;
  }
}